

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

StatementSpec * rsg::anon_unknown_0::chooseStatement(GeneratorState *state)

{
  Random *this;
  float fVar1;
  int local_4c;
  StatementSpec *pSStack_48;
  int ndx_1;
  StatementSpec *lastNonZero;
  StatementSpec *spec;
  int local_30;
  float p;
  int ndx;
  float sum;
  float weights [4];
  GeneratorState *state_local;
  
  p = 0.0;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    fVar1 = (*chooseStatement::statementSpecs[local_30].getWeight)(state);
    (&ndx)[local_30] = (int)fVar1;
    p = (float)(&ndx)[local_30] + p;
  }
  this = GeneratorState::getRandom(state);
  fVar1 = de::Random::getFloat(this,0.0,p);
  lastNonZero = (StatementSpec *)0x0;
  pSStack_48 = (StatementSpec *)0x0;
  p = 0.0;
  local_4c = 0;
  do {
    if (3 < local_4c) {
LAB_028bd56a:
      if (lastNonZero == (StatementSpec *)0x0) {
        lastNonZero = pSStack_48;
      }
      return lastNonZero;
    }
    p = (float)(&ndx)[local_4c] + p;
    if (fVar1 < p) {
      lastNonZero = chooseStatement::statementSpecs + local_4c;
      goto LAB_028bd56a;
    }
    if (0.0 < (float)(&ndx)[local_4c]) {
      pSStack_48 = chooseStatement::statementSpecs + local_4c;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

const StatementSpec* chooseStatement (GeneratorState& state)
{
	static const StatementSpec statementSpecs[] =
	{
		{ getWeight<BlockStatement>,		create<BlockStatement>			},
		{ getWeight<ExpressionStatement>,	create<ExpressionStatement>		},
		{ getWeight<DeclarationStatement>,	create<DeclarationStatement>	},
		{ getWeight<ConditionalStatement>,	create<ConditionalStatement>	}
	};

	float weights[DE_LENGTH_OF_ARRAY(statementSpecs)];

	// Compute weights
	float sum = 0.0f;
	for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(statementSpecs); ndx++)
	{
		weights[ndx] = statementSpecs[ndx].getWeight(state);
		sum += weights[ndx];
	}

	DE_ASSERT(sum > 0.0f);

	// Random number in range
	float p = state.getRandom().getFloat(0.0f, sum);

	const StatementSpec* spec			= DE_NULL;
	const StatementSpec* lastNonZero	= DE_NULL;

	// Find element in that point
	sum = 0.0f;
	for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(statementSpecs); ndx++)
	{
		sum += weights[ndx];
		if (p < sum)
		{
			spec = &statementSpecs[ndx];
			break;
		}
		else if (weights[ndx] > 0.0f)
			lastNonZero = &statementSpecs[ndx];
	}

	if (!spec)
		spec = lastNonZero;

	return spec;
}